

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qc_shm.c
# Opt level: O3

QcShm * qc_shm_open(char *name,QcErr *err)

{
  uint uVar1;
  int __fd;
  int iVar2;
  char *pcVar3;
  QcShm *__dest;
  uint *puVar4;
  long lVar5;
  stat sb;
  stat local_c0;
  
  __fd = shm_open(name,2,0x180);
  if (__fd == -1) {
    puVar4 = (uint *)__errno_location();
    qc_seterr(err,-1,"shm_open failed, name : %s errno=%d\n",name,(ulong)*puVar4);
  }
  else {
    iVar2 = fstat(__fd,&local_c0);
    if (iVar2 == -1) {
      puVar4 = (uint *)__errno_location();
      uVar1 = *puVar4;
      pcVar3 = "fstat failed, errno=%d\n";
    }
    else {
      pcVar3 = (char *)mmap((void *)0x0,local_c0.st_size,3,1,__fd,0);
      if (pcVar3 != (char *)0xffffffffffffffff) {
        close(__fd);
        lVar5 = 1;
        __dest = (QcShm *)calloc(1,0x98);
        if (__dest != (QcShm *)0x0) {
          strncpy((char *)__dest,name,0x80);
          __dest->shmaddr = pcVar3;
          __dest->shmsize = local_c0.st_size;
          return __dest;
        }
        qc_shm_open_cold_1();
        munmap(*(void **)(lVar5 + 0x88),*(size_t *)(lVar5 + 0x90));
        return (QcShm *)0x0;
      }
      puVar4 = (uint *)__errno_location();
      uVar1 = *puVar4;
      pcVar3 = "mmap faied, errno=%d\n";
    }
    qc_seterr(err,-1,pcVar3,(ulong)uVar1);
  }
  return (QcShm *)0x0;
}

Assistant:

QcShm* qc_shm_open(const char *name, QcErr *err)
{
    int flags, opt, fd;
    mode_t mode;
    char *addr;
    struct stat sb;

    flags = O_RDWR;  //just open
    mode  = S_IRUSR|S_IWUSR;

    fd = shm_open(name, flags, mode);
    if(fd == -1)
    {
        qc_seterr(err, -1, "shm_open failed, name : %s errno=%d\n", name, errno);
        return NULL;
    }

    if(fstat(fd, &sb) == -1)
    {
        qc_seterr(err, -1, "fstat failed, errno=%d\n", errno);
        return NULL;
    }

    addr = mmap(NULL, sb.st_size, PROT_READ|PROT_WRITE, MAP_SHARED, fd, 0);
    if(addr == MAP_FAILED)
    {
        qc_seterr(err, -1, "mmap faied, errno=%d\n", errno);
        return NULL;
    }

    close(fd);

    QcShm *qcShm;
    qc_malloc(qcShm, sizeof(QcShm));
    strncpy(qcShm->name, name, QC_SHMNAME_MAXLEN);
    qcShm->shmaddr = addr;
    qcShm->shmsize = sb.st_size;

    return qcShm;
}